

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcVibrationIsolatorType::~IfcVibrationIsolatorType
          (IfcVibrationIsolatorType *this,void **vtt)

{
  void **vtt_local;
  IfcVibrationIsolatorType *this_local;
  
  *(void **)&(this->super_IfcDiscreteAccessoryType).super_IfcElementComponentType.
             super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject = *vtt;
  *(void **)(&(this->super_IfcDiscreteAccessoryType).super_IfcElementComponentType.
              super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x0 +
            *(long *)(*(long *)&(this->super_IfcDiscreteAccessoryType).super_IfcElementComponentType
                                .super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject +
                     -0x18)) = vtt[0x34];
  *(void **)&(this->super_IfcDiscreteAccessoryType).super_IfcElementComponentType.
             super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0x88 = vtt[0x35];
  (this->super_IfcDiscreteAccessoryType).super_IfcElementComponentType.super_IfcElementType.
  super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)vtt[0x36];
  *(void **)&(this->super_IfcDiscreteAccessoryType).super_IfcElementComponentType.
             super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.field_0xf0 = vtt[0x37];
  *(void **)&(this->super_IfcDiscreteAccessoryType).super_IfcElementComponentType.
             super_IfcElementType.super_IfcTypeProduct.field_0x148 = vtt[0x38];
  *(void **)&(this->super_IfcDiscreteAccessoryType).super_IfcElementComponentType.
             super_IfcElementType.field_0x180 = vtt[0x39];
  *(void **)&(this->super_IfcDiscreteAccessoryType).super_IfcElementComponentType.
             super_IfcElementType.field_0x190 = vtt[0x3a];
  *(void **)&(this->super_IfcDiscreteAccessoryType).super_IfcElementComponentType.field_0x1a0 =
       vtt[0x3b];
  std::__cxx11::string::~string((string *)&(this->super_IfcDiscreteAccessoryType).field_0x1b0);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcVibrationIsolatorType,_1UL>::~ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcVibrationIsolatorType,_1UL> *)
             &(this->super_IfcDiscreteAccessoryType).super_IfcElementComponentType.field_0x1a0,
             vtt + 0x32);
  IfcDiscreteAccessoryType::~IfcDiscreteAccessoryType(&this->super_IfcDiscreteAccessoryType,vtt + 1)
  ;
  return;
}

Assistant:

IfcVibrationIsolatorType() : Object("IfcVibrationIsolatorType") {}